

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

BOOL __thiscall Js::FunctionProxy::IsDeferredDeserializeFunction(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  FunctionInfo *pFVar4;
  undefined4 *puVar5;
  FunctionProxy *pFVar6;
  FunctionProxy *this_local;
  
  pFVar4 = GetFunctionInfo(this);
  if (pFVar4 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x530,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pFVar4 = GetFunctionInfo(this);
  pFVar6 = FunctionInfo::GetFunctionProxy(pFVar4);
  if (pFVar6 != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x531,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pFVar4 = GetFunctionInfo(this);
  BVar3 = FunctionInfo::IsDeferredDeserializeFunction(pFVar4);
  return BVar3;
}

Assistant:

inline BOOL FunctionProxy::IsDeferredDeserializeFunction() const
    {
        Assert(GetFunctionInfo());
        Assert(GetFunctionInfo()->GetFunctionProxy() == this);
        return GetFunctionInfo()->IsDeferredDeserializeFunction();
    }